

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib4plus.hpp
# Opt level: O3

basic_istream<wchar_t,_std::char_traits<wchar_t>_> *
trng::operator>>(basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in,
                lagfib4plus<unsigned_long,_168U,_205U,_242U,_521U> *R)

{
  undefined4 uVar1;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *pbVar2;
  long lVar3;
  status_type S_new;
  delim_c local_2043;
  delim_c local_2042;
  delim_c local_2041;
  delim_str local_2040;
  status_type local_2038;
  
  memset(&local_2038,0,0x2004);
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  utility::operator>>(in,(ignore_spaces_cl *)&local_2040);
  local_2041.c = '[';
  pbVar2 = utility::operator>>(in,&local_2041);
  local_2040.str = lagfib4plus<unsigned_long,_168U,_205U,_242U,_521U>::name();
  pbVar2 = utility::operator>>(pbVar2,&local_2040);
  local_2042.c = ' ';
  pbVar2 = utility::operator>>(pbVar2,&local_2042);
  pbVar2 = operator>>(pbVar2,&local_2038);
  local_2043.c = ']';
  utility::operator>>(pbVar2,&local_2043);
  lVar3 = *(long *)(*(long *)in + -0x18);
  if (((byte)in[lVar3 + 0x20] & 5) == 0) {
    memcpy(R,&local_2038,0x2004);
    lVar3 = *(long *)(*(long *)in + -0x18);
  }
  *(undefined4 *)(in + lVar3 + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
        std::basic_istream<char_t, traits_t> &in, lagfib4plus &R) {
      typename lagfib4plus::status_type S_new;
      std::ios_base::fmtflags flags(in.flags());
      in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      in >> utility::ignore_spaces();
      in >> utility::delim('[') >> utility::delim(lagfib4plus::name()) >> utility::delim(' ') >>
          S_new >> utility::delim(']');
      if (in)
        R.S = S_new;
      in.flags(flags);
      return in;
    }